

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * wabt::GetSymbolTypeName(SymbolType type)

{
  char *pcStack_10;
  SymbolType type_local;
  
  switch(type) {
  case Function:
    pcStack_10 = "func";
    break;
  case Data:
    pcStack_10 = "data";
    break;
  case Global:
    pcStack_10 = "global";
    break;
  case Section:
    pcStack_10 = "section";
    break;
  case Event:
    pcStack_10 = "event";
    break;
  default:
    pcStack_10 = "<error_symbol_type>";
  }
  return pcStack_10;
}

Assistant:

static WABT_INLINE const char* GetSymbolTypeName(SymbolType type) {
  switch (type) {
    case SymbolType::Function:
      return "func";
    case SymbolType::Global:
      return "global";
    case SymbolType::Data:
      return "data";
    case SymbolType::Section:
      return "section";
    case SymbolType::Event:
      return "event";
    default:
      return "<error_symbol_type>";
  }
}